

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O2

void os_banner_goto(void *banner_handle,int row,int col)

{
  if (*banner_handle == 2) {
    *(int *)((long)banner_handle + 0x4c) = row;
    *(int *)((long)banner_handle + 0x48) = col;
  }
  return;
}

Assistant:

void os_banner_goto(void *banner_handle, int row, int col)
{
    osgen_win_t *win = (osgen_win_t *)banner_handle;

    /* check the window type */
    switch(win->win_type)
    {
    case OS_BANNER_TYPE_TEXTGRID:
        /* it's a text grid - move the output position */
        win->y = row;
        win->x = col;
        break;

    default:
        /* 
         *   this operation is meaningless with other window types - simply
         *   ignore it 
         */
        break;
    }
}